

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutengine.cpp
# Opt level: O1

QSize qSmartMinSize(QWidgetItem *i)

{
  int iVar1;
  undefined4 extraout_var;
  QSize QVar2;
  long in_FS_OFFSET;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_54;
  QSize local_50;
  QSize local_48;
  QSize local_40;
  QSize local_38;
  long local_30;
  QWidget *this;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (*(i->super_QLayoutItem)._vptr_QLayoutItem[0xd])();
  this = (QWidget *)CONCAT44(extraout_var,iVar1);
  local_38 = (QSize)(**(code **)(*(long *)this + 0x70))(this);
  local_40 = (QSize)(**(code **)(*(long *)this + 0x78))(this);
  local_48 = QWidget::minimumSize(this);
  local_50 = QWidget::maximumSize(this);
  local_54.bits = (Bits)QWidget::sizePolicy(this);
  QVar2 = qSmartMinSize(&local_38,&local_40,&local_48,&local_50,(QSizePolicy *)&local_54.bits);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

Q_WIDGETS_EXPORT QSize qSmartMinSize(const QWidgetItem *i)
{
    QWidget *w = i->widget();
    return qSmartMinSize(w->sizeHint(), w->minimumSizeHint(),
                            w->minimumSize(), w->maximumSize(),
                            w->sizePolicy());
}